

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

void __thiscall icu_63::TZGNCore::TZGNCore(TZGNCore *this,Locale *locale,UErrorCode *status)

{
  this->_vptr_TZGNCore = (_func_int **)&PTR__TZGNCore_003d2ac0;
  Locale::Locale(&this->fLocale,locale);
  this->fTimeZoneNames = (TimeZoneNames *)0x0;
  this->fLocationNamesMap = (UHashtable *)0x0;
  this->fPartialLocationNamesMap = (UHashtable *)0x0;
  SimpleFormatter::SimpleFormatter(&this->fRegionFormat);
  SimpleFormatter::SimpleFormatter(&this->fFallbackFormat);
  this->fLocaleDisplayNames = (LocaleDisplayNames *)0x0;
  ZNStringPool::ZNStringPool(&this->fStringPool,status);
  TextTrieMap::TextTrieMap(&this->fGNamesTrie,'\x01',deleteGNameInfo);
  this->fGNamesTrieFullyLoaded = '\0';
  initialize(this,locale,status);
  return;
}

Assistant:

TZGNCore::TZGNCore(const Locale& locale, UErrorCode& status)
: fLocale(locale),
  fTimeZoneNames(NULL),
  fLocationNamesMap(NULL),
  fPartialLocationNamesMap(NULL),
  fLocaleDisplayNames(NULL),
  fStringPool(status),
  fGNamesTrie(TRUE, deleteGNameInfo),
  fGNamesTrieFullyLoaded(FALSE) {
    initialize(locale, status);
}